

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# configfile.cc
# Opt level: O1

bool __thiscall ConfigFile::save(ConfigFile *this,string *path)

{
  char cVar1;
  Stream *this_00;
  size_t in_RCX;
  void *__buf;
  ofstream file;
  undefined1 auStack_248 [8];
  size_type *local_240;
  size_type local_230 [2];
  filebuf local_220 [8];
  filebuf local_218 [240];
  ios_base local_128 [264];
  
  std::ofstream::ofstream(local_220,(string *)path,_S_trunc);
  cVar1 = std::__basic_file<char>::is_open();
  if (cVar1 == '\0') {
    local_240 = local_230;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_240,"config","");
    Log::Logger::operator[]((Logger *)auStack_248,(string *)&Log::Error);
    this_00 = Log::Stream::operator<<((Stream *)auStack_248,"Failed to open config file \'");
    std::__ostream_insert<char,std::char_traits<char>>
              (this_00->stream,(path->_M_dataplus)._M_p,path->_M_string_length);
    Log::Stream::operator<<(this_00,"\'");
    Log::Stream::~Stream((Stream *)auStack_248);
    if (local_240 != local_230) {
      operator_delete(local_240,local_230[0] + 1);
    }
  }
  else {
    write(this,(int)local_220,__buf,in_RCX);
  }
  local_220[0] = (filebuf)std::ofstream::VTT;
  local_220[1] = (filebuf)std::ofstream::VTT_1;
  local_220[2] = (filebuf)uRam000000000015bc72;
  local_220[3] = (filebuf)uRam000000000015bc73;
  local_220[4] = (filebuf)uRam000000000015bc74;
  local_220[5] = (filebuf)uRam000000000015bc75;
  local_220[6] = (filebuf)uRam000000000015bc76;
  local_220[7] = (filebuf)uRam000000000015bc77;
  *(undefined8 *)(local_218 + *(long *)(_VTT + -0x18) + -8) = _write;
  std::filebuf::~filebuf(local_218);
  std::ios_base::~ios_base(local_128);
  return (bool)cVar1;
}

Assistant:

bool
ConfigFile::save(const std::string &path) {
  std::ofstream file(path, std::ios_base::trunc);
  if (!file.is_open()) {
    Log::Error["config"] << "Failed to open config file '" << path << "'";
    return false;
  }

  return write(&file);
}